

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3EvalStartReaders(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pRc)

{
  int iVar1;
  Fts3Expr *in_RDX;
  Fts3Cursor *in_RSI;
  int i;
  int nToken;
  int in_stack_0000002c;
  Fts3Cursor *in_stack_00000030;
  bool local_21;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  undefined4 in_stack_ffffffffffffffe4;
  
  if ((in_RSI != (Fts3Cursor *)0x0) && (in_RDX->eType == 0)) {
    if (*(int *)&(in_RSI->base).pVtab == 5) {
      iVar1 = *(int *)(*(long *)&in_RSI->iLangid + 0x50);
      if (iVar1 != 0) {
        iVar2 = 0;
        while ((iVar2 < iVar1 &&
               (*(long *)(*(long *)&in_RSI->iLangid + (long)iVar2 * 0x28 + 0x70) != 0))) {
          iVar2 = iVar2 + 1;
        }
        *(bool *)((long)&in_RSI->iPrevId + 2) = iVar2 == iVar1;
      }
      iVar1 = fts3EvalPhraseStart(in_stack_00000030,in_stack_0000002c,(Fts3Phrase *)pCsr);
      in_RDX->eType = iVar1;
    }
    else {
      fts3EvalStartReaders
                (in_RSI,in_RDX,(int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0))
      ;
      fts3EvalStartReaders
                (in_RSI,in_RDX,(int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0))
      ;
      local_21 = false;
      if (in_RSI->pStmt[0x32] != (sqlite3_stmt)0x0) {
        local_21 = in_RSI->pExpr->bDeferred != '\0';
      }
      *(bool *)((long)&in_RSI->iPrevId + 2) = local_21;
    }
  }
  return;
}

Assistant:

static void fts3EvalStartReaders(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pExpr,                /* Expression to initialize phrases in */
  int *pRc                        /* IN/OUT: Error code */
){
  if( pExpr && SQLITE_OK==*pRc ){
    if( pExpr->eType==FTSQUERY_PHRASE ){
      int nToken = pExpr->pPhrase->nToken;
      if( nToken ){
        int i;
        for(i=0; i<nToken; i++){
          if( pExpr->pPhrase->aToken[i].pDeferred==0 ) break;
        }
        pExpr->bDeferred = (i==nToken);
      }
      *pRc = fts3EvalPhraseStart(pCsr, 1, pExpr->pPhrase);
    }else{
      fts3EvalStartReaders(pCsr, pExpr->pLeft, pRc);
      fts3EvalStartReaders(pCsr, pExpr->pRight, pRc);
      pExpr->bDeferred = (pExpr->pLeft->bDeferred && pExpr->pRight->bDeferred);
    }
  }
}